

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_execute(lua_State *L)

{
  lua_CFunction *pp_Var1;
  double dVar2;
  byte bVar3;
  lua_CFunction p_Var4;
  StkId pTVar5;
  global_State *p;
  Upvaldesc *pUVar6;
  Value *pVVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  TValue *pTVar11;
  uint *puVar12;
  GCObject *pGVar13;
  UpVal *pUVar14;
  StkId pTVar15;
  code *pcVar16;
  int *piVar17;
  StkId pTVar18;
  Instruction *pIVar19;
  undefined4 *puVar20;
  long lVar21;
  ulong uVar22;
  StkId pTVar23;
  TValue *rb;
  long lVar24;
  uint uVar25;
  Upvaldesc *uv;
  CallInfo *pCVar26;
  TValue *io1;
  TValue *pTVar27;
  char *fmt;
  int iVar28;
  TMS op;
  lu_byte *plVar29;
  uint uVar30;
  TValue *val;
  ulong uVar31;
  TValue *io;
  CallInfo *pCVar32;
  uint uVar33;
  double dVar34;
  lua_Number lVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  pCVar26 = L->ci;
LAB_00110e9e:
  pTVar18 = (pCVar26->u).l.base;
  p_Var4 = (pCVar26->func->value_).f;
  pTVar5 = *(StkId *)(*(long *)(p_Var4 + 0x18) + 0x10);
LAB_00110ec0:
  do {
    puVar12 = (pCVar26->u).l.savedpc;
    (pCVar26->u).l.savedpc = puVar12 + 1;
    uVar33 = *puVar12;
    bVar3 = L->hookmask;
    if ((bVar3 & 0xc) != 0) {
      piVar17 = &L->hookcount;
      *piVar17 = *piVar17 + -1;
      if (*piVar17 == 0) {
        pCVar32 = L->ci;
        if ((bVar3 & 8) == 0) goto LAB_00110efc;
        L->hookcount = L->basehookcount;
        plVar29 = &pCVar32->callstatus;
        bVar9 = pCVar32->callstatus;
        if (-1 < (char)bVar9) {
          luaD_hook(L,3,-1);
          bVar8 = true;
          goto LAB_00110f31;
        }
LAB_00110f66:
        *plVar29 = bVar9 & 0x7f;
      }
      else {
        if ((bVar3 & 4) == 0) goto LAB_00110fcf;
        pCVar32 = L->ci;
LAB_00110efc:
        plVar29 = &pCVar32->callstatus;
        bVar9 = pCVar32->callstatus;
        if ((char)bVar9 < '\0') goto LAB_00110f66;
        bVar8 = false;
LAB_00110f31:
        if ((bVar3 & 4) != 0) {
          pIVar19 = (pCVar32->u).l.savedpc;
          lVar21 = *(long *)((pCVar32->func->value_).f + 0x18);
          lVar24 = *(long *)(lVar21 + 0x18);
          lVar21 = *(long *)(lVar21 + 0x28);
          iVar28 = (int)((ulong)((long)pIVar19 - lVar24) >> 2) + -1;
          if (lVar21 == 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = *(int *)(lVar21 + (long)iVar28 * 4);
          }
          if ((iVar28 != 0) && (L->oldpc < pIVar19)) {
            if (lVar21 == 0) {
              iVar28 = 0;
            }
            else {
              iVar28 = *(int *)(lVar21 + (((long)L->oldpc - lVar24) * 0x40000000 + -0x100000000 >>
                                         0x20) * 4);
            }
            if (iVar10 == iVar28) goto LAB_00110fb4;
          }
          luaD_hook(L,2,iVar10);
        }
LAB_00110fb4:
        pIVar19 = (pCVar32->u).l.savedpc;
        L->oldpc = pIVar19;
        if (L->status == '\x01') {
          if (bVar8) {
            L->hookcount = 1;
            pIVar19 = (pCVar32->u).l.savedpc;
          }
          (pCVar32->u).l.savedpc = pIVar19 + -1;
          *plVar29 = *plVar29 | 0x80;
          pCVar32->func = L->top + -1;
          luaD_throw(L,1);
        }
      }
      pTVar18 = (pCVar26->u).l.base;
    }
LAB_00110fcf:
  } while (0x26 < (uVar33 & 0x3f));
  uVar30 = uVar33 >> 6 & 0xff;
  pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar30 << 4));
  pTVar15 = pTVar18;
  switch(uVar33 & 0x3f) {
  case 0:
    uVar31 = (ulong)(uVar33 >> 0x13 & 0xfffffff0);
    pTVar27->value_ = *(Value *)((long)&pTVar18->value_ + uVar31);
    pTVar27->tt_ = *(int *)((long)&pTVar18->tt_ + uVar31);
    goto LAB_00110ec0;
  case 1:
    uVar31 = (ulong)(uVar33 >> 10 & 0xfffffff0);
    pTVar27->value_ = *(Value *)((long)&pTVar5->value_ + uVar31);
    pTVar27->tt_ = *(int *)((long)&pTVar5->tt_ + uVar31);
    goto LAB_00110ec0;
  case 2:
    puVar12 = (pCVar26->u).l.savedpc;
    (pCVar26->u).l.savedpc = puVar12 + 1;
    uVar31 = (ulong)(*puVar12 >> 2 & 0xfffffff0);
    pTVar27->value_ = *(Value *)((long)&pTVar5->value_ + uVar31);
    pTVar27->tt_ = *(int *)((long)&pTVar5->tt_ + uVar31);
    goto LAB_00110ec0;
  case 3:
    (pTVar27->value_).b = uVar33 >> 0x17;
    pTVar27->tt_ = 1;
    if ((uVar33 & 0x7fc000) != 0) goto LAB_001115b2;
    goto LAB_00110ec0;
  case 4:
    uVar33 = uVar33 >> 0x17;
    auVar37._4_4_ = 0;
    auVar37._0_4_ = uVar33;
    auVar37._8_4_ = uVar33;
    auVar37._12_4_ = 0;
    puVar20 = (undefined4 *)((long)&pTVar18[3].tt_ + (ulong)(uVar30 << 4));
    uVar31 = 0;
    do {
      auVar39 = _DAT_0011c370;
      auVar38._8_4_ = (int)uVar31;
      auVar38._0_8_ = uVar31;
      auVar38._12_4_ = (int)(uVar31 >> 0x20);
      auVar40 = auVar37 | _DAT_0011c370;
      auVar41 = (_DAT_0011c360 | auVar38) ^ _DAT_0011c370;
      iVar28 = auVar40._4_4_;
      if ((bool)(~(auVar41._4_4_ == iVar28 && auVar40._0_4_ < auVar41._0_4_ ||
                  iVar28 < auVar41._4_4_) & 1)) {
        puVar20[-0xc] = 0;
      }
      if ((auVar41._12_4_ != auVar40._12_4_ || auVar41._8_4_ <= auVar40._8_4_) &&
          auVar41._12_4_ <= auVar40._12_4_) {
        puVar20[-8] = 0;
      }
      auVar39 = (auVar38 | _DAT_0011c350) ^ auVar39;
      iVar10 = auVar39._4_4_;
      if (iVar10 <= iVar28 && (iVar10 != iVar28 || auVar39._0_4_ <= auVar40._0_4_)) {
        puVar20[-4] = 0;
        *puVar20 = 0;
      }
      uVar31 = uVar31 + 4;
      puVar20 = puVar20 + 0x10;
    } while ((uVar33 + 4 & 0xfffffffc) != uVar31);
    goto LAB_00110ec0;
  case 5:
    pVVar7 = *(Value **)(*(long *)(p_Var4 + (ulong)(uVar33 >> 0x17) * 8 + 0x20) + 0x10);
    pTVar27->value_ = *pVVar7;
    pTVar27->tt_ = pVVar7[1].b;
    goto LAB_00110ec0;
  case 6:
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    pTVar11 = *(TValue **)(*(long *)(p_Var4 + (ulong)(uVar33 >> 0x17) * 8 + 0x20) + 0x10);
    pTVar15 = pTVar18;
    goto LAB_00111878;
  case 7:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar15 = pTVar5;
    }
    goto LAB_00111878;
  case 8:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      pTVar11 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    pTVar27 = *(TValue **)(*(long *)(p_Var4 + (ulong)uVar30 * 8 + 0x20) + 0x10);
    pTVar18 = (StkId)((long)&pTVar18->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    goto LAB_0011198b;
  case 9:
    pGVar13 = *(GCObject **)(p_Var4 + (ulong)(uVar33 >> 0x17) * 8 + 0x20);
    pTVar11 = (pGVar13->h).array;
    pTVar11->value_ = pTVar27->value_;
    uVar33 = pTVar27->tt_;
    pTVar11->tt_ = uVar33;
    if ((((uVar33 & 0x40) != 0) && (((((pTVar27->value_).gc)->gch).marked & 3) != 0)) &&
       (((pGVar13->gch).marked & 4) != 0)) {
      luaC_barrier_(L,pGVar13,(pTVar27->value_).gc);
    }
    goto LAB_00110ec0;
  case 10:
    pTVar11 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      pTVar11 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    pTVar18 = (StkId)((long)&pTVar18->value_ + (ulong)(uVar33 >> 10 & 0xff0));
LAB_0011198b:
    luaV_settable(L,pTVar27,pTVar11,pTVar18);
    goto LAB_00111c46;
  case 0xb:
    pGVar13 = (GCObject *)luaH_new(L);
    uVar30 = uVar33 >> 0xe & 0x1ff;
    (pTVar27->value_).gc = pGVar13;
    pTVar27->tt_ = 0x45;
    if (uVar30 != 0 || 0x7fffff < uVar33) {
      iVar28 = luaO_fb2int(uVar33 >> 0x17);
      iVar10 = luaO_fb2int(uVar30);
      luaH_resize(L,&pGVar13->h,iVar28,iVar10);
    }
    lVar21 = L->l_G->GCdebt;
    goto joined_r0x00111f09;
  case 0xc:
    uVar31 = (ulong)(uVar33 >> 0x13 & 0xfffffff0);
    pTVar11 = (TValue *)((long)&pTVar18->value_ + uVar31);
    pTVar27[1].value_ = *(Value *)((long)&pTVar18->value_ + uVar31);
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar15 = pTVar5;
    }
    pTVar27[1].tt_ = *(int *)((long)&pTVar18->tt_ + uVar31);
LAB_00111878:
    luaV_gettable(L,pTVar11,(TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0)),
                  pTVar27);
    goto LAB_00111c46;
  case 0xd:
    rb = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar33 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    if ((rb->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar35 = (rb->value_).n + (pTVar11->value_).n;
LAB_001118f8:
      (pTVar27->value_).n = lVar35;
      pTVar27->tt_ = 3;
      goto LAB_00110ec0;
    }
    op = TM_ADD;
    break;
  case 0xe:
    rb = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar33 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    if ((rb->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar35 = (rb->value_).n - (pTVar11->value_).n;
      goto LAB_001118f8;
    }
    op = TM_SUB;
    break;
  case 0xf:
    rb = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar33 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    if ((rb->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar35 = (rb->value_).n * (pTVar11->value_).n;
      goto LAB_001118f8;
    }
    op = TM_MUL;
    break;
  case 0x10:
    rb = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar33 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    if ((rb->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar35 = (rb->value_).n / (pTVar11->value_).n;
      goto LAB_001118f8;
    }
    op = TM_DIV;
    break;
  case 0x11:
    rb = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar33 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    if ((rb->tt_ == 3) && (pTVar11->tt_ == 3)) {
      dVar36 = (rb->value_).n;
      dVar2 = (pTVar11->value_).n;
      dVar34 = floor(dVar36 / dVar2);
      (pTVar27->value_).n = dVar36 - dVar34 * dVar2;
      pTVar27->tt_ = 3;
      goto LAB_00110ec0;
    }
    op = TM_MOD;
    break;
  case 0x12:
    rb = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    pTVar15 = pTVar5;
    if ((uVar33 >> 0x16 & 1) == 0) {
      pTVar15 = pTVar18;
    }
    pTVar11 = (TValue *)((long)&pTVar15->value_ + (ulong)(uVar33 >> 10 & 0xff0));
    if ((rb->tt_ == 3) && (pTVar11->tt_ == 3)) {
      lVar35 = pow((rb->value_).n,(pTVar11->value_).n);
      goto LAB_001118f8;
    }
    op = TM_POW;
    break;
  case 0x13:
    uVar31 = (ulong)(uVar33 >> 0x13 & 0xfffffff0);
    pTVar11 = (TValue *)((long)&pTVar18->value_ + uVar31);
    if (*(int *)((long)&pTVar18->tt_ + uVar31) == 3) {
      (pTVar27->value_).gc = (GCObject *)((ulong)(pTVar11->value_).gc ^ 0x8000000000000000);
      pTVar27->tt_ = 3;
      goto LAB_00110ec0;
    }
    op = TM_UNM;
    rb = pTVar11;
    break;
  case 0x14:
    uVar31 = (ulong)(uVar33 >> 0x13 & 0xfffffff0);
    iVar28 = *(int *)((long)&pTVar18->tt_ + uVar31);
    if (iVar28 == 0) {
      uVar33 = 1;
    }
    else if (iVar28 == 1) {
      uVar33 = (uint)(*(int *)((long)&pTVar18->value_ + uVar31) == 0);
    }
    else {
      uVar33 = 0;
    }
    *(uint *)&pTVar27->value_ = uVar33;
    pTVar27->tt_ = 1;
    goto LAB_00110ec0;
  case 0x15:
    luaV_objlen(L,pTVar27,(TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0)))
    ;
    goto LAB_00111c46;
  case 0x16:
    uVar25 = uVar33 >> 0x17;
    uVar33 = uVar33 >> 0xe & 0x1ff;
    L->top = (StkId)((long)&pTVar18[1].value_ + (ulong)(uVar33 << 4));
    luaV_concat(L,(uVar33 - uVar25) + 1);
    pTVar18 = (pCVar26->u).l.base;
    uVar31 = (ulong)(uVar30 << 4);
    uVar22 = (ulong)(uVar25 << 4);
    *(undefined8 *)((long)&pTVar18->value_ + uVar31) =
         *(undefined8 *)((long)&pTVar18->value_ + uVar22);
    *(undefined4 *)((long)&pTVar18->tt_ + uVar31) = *(undefined4 *)((long)&pTVar18->tt_ + uVar22);
    if (L->l_G->GCdebt < 1) {
      pTVar15 = pCVar26->top;
    }
    else {
      pTVar15 = (StkId)((long)&pTVar18[1].value_ + uVar31);
      if (uVar30 < uVar25) {
        pTVar15 = (StkId)((long)&pTVar18->value_ + uVar22);
      }
      L->top = pTVar15;
      luaC_step(L);
      pTVar15 = pCVar26->top;
      L->top = pTVar15;
    }
    pTVar18 = (pCVar26->u).l.base;
    L->top = pTVar15;
    goto LAB_00110ec0;
  case 0x17:
    if (uVar30 != 0) {
      luaF_close(L,(StkId)((long)&(pCVar26->u).l.base[-1].value_ + (ulong)(uVar30 << 4)));
    }
    goto LAB_00111ae7;
  case 0x18:
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    uVar31 = (ulong)(uVar33 >> 10 & 0xff0);
    uVar33 = 0;
    if (pTVar27->tt_ == *(int *)((long)&pTVar18->tt_ + uVar31)) {
      iVar28 = luaV_equalobj_(L,pTVar27,(TValue *)((long)&pTVar18->value_ + uVar31));
      uVar33 = (uint)(iVar28 != 0);
    }
    puVar12 = (pCVar26->u).l.savedpc;
    if (uVar33 == uVar30) {
      uVar33 = *puVar12;
      uVar30 = uVar33 >> 6 & 0xff;
      if (uVar30 != 0) {
        luaF_close(L,(StkId)((long)&(pCVar26->u).l.base[-1].value_ + (ulong)(uVar30 << 4)));
        puVar12 = (pCVar26->u).l.savedpc;
      }
      puVar12 = puVar12 + ((ulong)(uVar33 >> 0xe) - 0x1fffe);
    }
    else {
      puVar12 = puVar12 + 1;
    }
    (pCVar26->u).l.savedpc = puVar12;
    goto LAB_00111c46;
  case 0x19:
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    uVar33 = luaV_lessthan(L,pTVar27,
                           (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 10 & 0xff0)));
    goto LAB_00111bcb;
  case 0x1a:
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    if ((int)uVar33 < 0) {
      pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar33 >> 0x13 & 0xff0));
    }
    if ((uVar33 >> 0x16 & 1) != 0) {
      pTVar18 = pTVar5;
    }
    uVar33 = luaV_lessequal(L,pTVar27,
                            (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 10 & 0xff0)));
LAB_00111bcb:
    puVar12 = (pCVar26->u).l.savedpc;
    if (uVar33 == uVar30) {
      uVar33 = *puVar12;
      uVar30 = uVar33 >> 6 & 0xff;
      if (uVar30 != 0) {
        luaF_close(L,(StkId)((long)&(pCVar26->u).l.base[-1].value_ + (ulong)(uVar30 << 4)));
        puVar12 = (pCVar26->u).l.savedpc;
      }
      puVar12 = puVar12 + ((ulong)(uVar33 >> 0xe) - 0x1fffe);
    }
    else {
      puVar12 = puVar12 + 1;
    }
    (pCVar26->u).l.savedpc = puVar12;
    goto LAB_00111c46;
  case 0x1b:
    iVar28 = pTVar27->tt_;
    if ((uVar33 & 0x7fc000) == 0) {
      if ((iVar28 == 0) || ((iVar28 == 1 && ((pTVar27->value_).b == 0)))) goto LAB_00111e94;
    }
    else if ((iVar28 != 0) && ((iVar28 != 1 || ((pTVar27->value_).b != 0)))) {
LAB_00111e94:
      puVar12 = (pCVar26->u).l.savedpc;
      uVar33 = *puVar12;
      uVar30 = uVar33 >> 6 & 0xff;
      if (uVar30 != 0) {
        luaF_close(L,(StkId)((long)&(pCVar26->u).l.base[-1].value_ + (ulong)(uVar30 << 4)));
        puVar12 = (pCVar26->u).l.savedpc;
      }
      pcVar16 = (code *)(puVar12 + ((ulong)(uVar33 >> 0xe) - 0x1fffe));
      goto LAB_00111ed0;
    }
LAB_001115b2:
    pp_Var1 = &(pCVar26->u).c.k;
    *pp_Var1 = *pp_Var1 + 4;
    goto LAB_00110ec0;
  case 0x1c:
    uVar31 = (ulong)(uVar33 >> 0x13 & 0xfffffff0);
    pVVar7 = (Value *)((long)&pTVar18->value_ + uVar31);
    iVar28 = *(int *)((long)&pTVar18->tt_ + uVar31);
    if ((uVar33 & 0x7fc000) == 0) {
      if ((iVar28 == 0) || ((iVar28 == 1 && (iVar28 = 1, pVVar7->b == 0)))) goto LAB_00111e8a;
    }
    else if ((iVar28 != 0) && ((iVar28 != 1 || (iVar28 = 1, pVVar7->b != 0)))) {
LAB_00111e8a:
      pTVar27->value_ = *pVVar7;
      pTVar27->tt_ = iVar28;
      goto LAB_00111e94;
    }
    pcVar16 = (pCVar26->u).c.k + 4;
    goto LAB_00111ed0;
  case 0x1d:
    if (0x7fffff < uVar33) {
      L->top = (StkId)((long)&pTVar27->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    }
    uVar33 = uVar33 >> 0xe & 0x1ff;
    iVar28 = luaD_precall(L,pTVar27,uVar33 - 1);
    if (iVar28 != 0) {
      if (uVar33 == 0) goto LAB_00111c46;
      goto LAB_00111f21;
    }
    pCVar26 = L->ci;
    pCVar26->callstatus = pCVar26->callstatus | 4;
    goto LAB_00110e9e;
  case 0x1e:
    if (0x7fffff < uVar33) {
      L->top = (StkId)((long)&pTVar27->value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
    }
    iVar28 = luaD_precall(L,pTVar27,-1);
    if (iVar28 != 0) {
      pTVar18 = (pCVar26->u).l.base;
      goto LAB_00110ec0;
    }
    pCVar32 = L->ci;
    pTVar18 = pCVar32->func;
    pCVar26 = pCVar32->previous;
    pTVar5 = pCVar26->func;
    bVar3 = *(byte *)(*(long *)((pTVar18->value_).f + 0x18) + 0x78);
    pTVar15 = (pCVar32->u).l.base;
    if (0 < *(int *)(*(long *)(p_Var4 + 0x18) + 0x60)) {
      luaF_close(L,(pCVar26->u).l.base);
    }
    piVar17 = &pTVar5->tt_;
    for (pTVar23 = pTVar18; pTVar23 < pTVar15 + bVar3; pTVar23 = pTVar23 + 1) {
      ((TValue *)(piVar17 + -2))->value_ = pTVar23->value_;
      *piVar17 = pTVar23->tt_;
      piVar17 = piVar17 + 4;
    }
    (pCVar26->u).l.base = (StkId)(((long)(pCVar32->u).l.base - (long)pTVar18) + (long)pTVar5);
    pTVar18 = (StkId)((long)L->top + ((long)pTVar5 - (long)pTVar18));
    L->top = pTVar18;
    pCVar26->top = pTVar18;
    (pCVar26->u).l.savedpc = (pCVar32->u).l.savedpc;
    pCVar26->callstatus = pCVar26->callstatus | 0x40;
    L->ci = pCVar26;
    goto LAB_00110e9e;
  case 0x1f:
    goto switchD_00111000_caseD_1f;
  case 0x20:
    dVar36 = (pTVar27->value_).n + pTVar27[2].value_.n;
    if (pTVar27[2].value_.n <= 0.0) {
      if (dVar36 < pTVar27[1].value_.n) goto LAB_00110ec0;
    }
    else if (pTVar27[1].value_.n < dVar36) goto LAB_00110ec0;
    (pCVar26->u).l.savedpc = (pCVar26->u).l.savedpc + ((ulong)(uVar33 >> 0xe) - 0x1ffff);
    (pTVar27->value_).n = dVar36;
    pTVar27->tt_ = 3;
    pTVar27[3].value_.n = dVar36;
    pTVar27[3].tt_ = 3;
    goto LAB_00110ec0;
  case 0x21:
    if ((pTVar27->tt_ != 3) && (pTVar11 = luaV_tonumber(pTVar27,pTVar27), pTVar11 == (TValue *)0x0))
    {
      fmt = "\'for\' initial value must be a number";
LAB_0011209e:
      luaG_runerror(L,fmt);
    }
    if ((pTVar27[1].tt_ != 3) &&
       (pTVar11 = luaV_tonumber(pTVar27 + 1,pTVar27 + 1), pTVar11 == (TValue *)0x0)) {
      fmt = "\'for\' limit must be a number";
      goto LAB_0011209e;
    }
    pTVar11 = pTVar27 + 2;
    if ((pTVar27[2].tt_ != 3) &&
       (pTVar11 = luaV_tonumber(pTVar11,pTVar11), pTVar11 == (TValue *)0x0)) {
      fmt = "\'for\' step must be a number";
      goto LAB_0011209e;
    }
    (pTVar27->value_).n = (pTVar27->value_).n - (pTVar11->value_).n;
    pTVar27->tt_ = 3;
    goto LAB_00111ae7;
  case 0x22:
    pTVar27[5].value_ = pTVar27[2].value_;
    pTVar27[5].tt_ = pTVar27[2].tt_;
    pTVar27[4].value_ = pTVar27[1].value_;
    pTVar27[4].tt_ = pTVar27[1].tt_;
    pTVar27[3].value_ = pTVar27->value_;
    pTVar27[3].tt_ = pTVar27->tt_;
    L->top = pTVar27 + 6;
    luaD_call(L,pTVar27 + 3,uVar33 >> 0xe & 0x1ff,1);
    pTVar18 = (pCVar26->u).l.base;
    L->top = pCVar26->top;
    puVar12 = (pCVar26->u).l.savedpc;
    (pCVar26->u).l.savedpc = puVar12 + 1;
    uVar33 = *puVar12;
    pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar33 >> 2 & 0xff0));
  case 0x23:
    iVar28 = pTVar27[1].tt_;
    if (iVar28 != 0) {
      pTVar27->value_ = pTVar27[1].value_;
      pTVar27->tt_ = iVar28;
LAB_00111ae7:
      pcVar16 = (code *)((pCVar26->u).l.savedpc + ((ulong)(uVar33 >> 0xe) - 0x1ffff));
LAB_00111ed0:
      (pCVar26->u).l.savedpc = (Instruction *)pcVar16;
    }
    goto LAB_00110ec0;
  case 0x24:
    if (uVar33 < 0x800000) {
      uVar25 = (int)((ulong)((long)L->top - (long)pTVar27) >> 4) - 1;
    }
    else {
      uVar25 = uVar33 >> 0x17;
    }
    uVar33 = uVar33 >> 0xe & 0x1ff;
    if (uVar33 == 0) {
      puVar12 = (pCVar26->u).l.savedpc;
      (pCVar26->u).l.savedpc = puVar12 + 1;
      uVar33 = *puVar12 >> 6;
    }
    pGVar13 = (pTVar27->value_).gc;
    iVar28 = uVar33 * 0x32 + uVar25 + -0x32;
    if ((pGVar13->h).sizearray < iVar28) {
      luaH_resizearray(L,&pGVar13->h,iVar28);
    }
    pTVar27 = (TValue *)((long)&pTVar18[uVar25].value_ + (ulong)(uVar30 << 4));
    for (; 0 < (int)uVar25; uVar25 = uVar25 - 1) {
      luaH_setint(L,&pGVar13->h,uVar33 * 0x32 + -0x32 + uVar25,pTVar27);
      if ((((pTVar27->tt_ & 0x40) != 0) && (((byte)(pTVar27->value_).f[9] & 3) != 0)) &&
         (((pGVar13->gch).marked & 4) != 0)) {
        luaC_barrierback_(L,pGVar13);
      }
      pTVar27 = pTVar27 + -1;
    }
    L->top = pCVar26->top;
    goto LAB_00110ec0;
  case 0x25:
    p = *(global_State **)(*(long *)(*(long *)(p_Var4 + 0x18) + 0x20) + (ulong)(uVar33 >> 0xe) * 8);
    pUVar6 = *(Upvaldesc **)&(p->strt).nuse;
    pGVar13 = (p->l_registry).value_.gc;
    uVar33 = p->seed;
    if (pGVar13 == (GCObject *)0x0) {
      uVar31 = 0;
      if (0 < (int)uVar33) {
        uVar31 = (ulong)uVar33;
      }
    }
    else {
      lVar21 = 0;
      uVar31 = 0;
      if (0 < (int)uVar33) {
        uVar31 = (ulong)uVar33;
      }
      do {
        if (uVar31 * 8 - lVar21 == 0) {
          (pTVar27->value_).gc = pGVar13;
          pTVar27->tt_ = 0x46;
          goto LAB_00111efb;
        }
        if ((&pUVar6->instack)[lVar21 * 2] == '\0') {
          pTVar15 = *(StkId *)(*(long *)(p_Var4 + (ulong)(&pUVar6->idx)[lVar21 * 2] * 8 + 0x20) +
                              0x10);
        }
        else {
          pTVar15 = pTVar18 + (&pUVar6->idx)[lVar21 * 2];
        }
        lVar24 = lVar21 + 0x20;
        lVar21 = lVar21 + 8;
      } while (*(StkId *)(*(long *)((long)pGVar13 + lVar24) + 0x10) == pTVar15);
    }
    pGVar13 = (GCObject *)luaF_newLclosure(L,uVar33);
    (pGVar13->th).l_G = p;
    (pTVar27->value_).gc = pGVar13;
    pTVar27->tt_ = 0x46;
    for (lVar21 = 0; uVar31 * 8 != lVar21; lVar21 = lVar21 + 8) {
      if ((&pUVar6->instack)[lVar21 * 2] == '\0') {
        pUVar14 = *(UpVal **)(p_Var4 + (ulong)(&pUVar6->idx)[lVar21 * 2] * 8 + 0x20);
      }
      else {
        pUVar14 = luaF_findupval(L,pTVar18 + (&pUVar6->idx)[lVar21 * 2]);
      }
      *(UpVal **)((long)pGVar13 + lVar21 + 0x20) = pUVar14;
    }
    if (((ulong)p->ud & 0x400) != 0) {
      luaC_barrierproto_(L,(Proto *)p,&pGVar13->cl);
    }
    (p->l_registry).value_.gc = pGVar13;
LAB_00111efb:
    lVar21 = L->l_G->GCdebt;
joined_r0x00111f09:
    if (0 < lVar21) {
      L->top = pTVar27 + 1;
      luaC_step(L);
LAB_00111f21:
      L->top = pCVar26->top;
    }
    goto LAB_00111c46;
  case 0x26:
    uVar25 = ~(uint)*(byte *)(*(long *)(p_Var4 + 0x18) + 0x78) +
             (int)((ulong)((long)pTVar18 - (long)pCVar26->func) >> 4);
    if (uVar33 < 0x800000) {
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)(int)uVar25) {
        luaD_growstack(L,uVar25);
      }
      pTVar18 = (pCVar26->u).l.base;
      pTVar27 = (TValue *)((long)&pTVar18->value_ + (ulong)(uVar30 << 4));
      L->top = pTVar27 + (int)uVar25;
      uVar33 = uVar25;
    }
    else {
      uVar33 = (uVar33 >> 0x17) - 1;
    }
    lVar21 = (long)(int)uVar25;
    uVar22 = 0;
    uVar31 = (ulong)uVar33;
    if ((int)uVar33 < 1) {
      uVar31 = uVar22;
    }
    lVar24 = 8;
    for (; uVar31 != uVar22; uVar22 = uVar22 + 1) {
      if ((long)uVar22 < lVar21) {
        *(undefined8 *)((long)pTVar27 + lVar24 + -8) =
             *(undefined8 *)((long)pTVar18 + lVar24 + lVar21 * -0x10 + -8);
        *(undefined4 *)((long)&pTVar27->value_ + lVar24) =
             *(undefined4 *)((long)&pTVar18[-lVar21].value_ + lVar24);
      }
      else {
        *(undefined4 *)((long)&pTVar27->value_ + lVar24) = 0;
      }
      lVar24 = lVar24 + 0x10;
    }
    goto LAB_00110ec0;
  }
  luaV_arith(L,pTVar27,rb,pTVar11,op);
LAB_00111c46:
  pTVar18 = (pCVar26->u).l.base;
  goto LAB_00110ec0;
switchD_00111000_caseD_1f:
  if (0x7fffff < uVar33) {
    L->top = (StkId)((long)&pTVar27[-1].value_ + (ulong)(uVar33 >> 0x13 & 0xfffffff0));
  }
  if (0 < *(int *)(*(long *)(p_Var4 + 0x18) + 0x60)) {
    luaF_close(L,pTVar18);
  }
  iVar28 = luaD_poscall(L,pTVar27);
  if ((pCVar26->callstatus & 4) == 0) {
    return;
  }
  pCVar26 = L->ci;
  if (iVar28 != 0) {
    L->top = pCVar26->top;
  }
  goto LAB_00110e9e;
}

Assistant:

void luaV_execute (lua_State *L) {
  CallInfo *ci = L->ci;
  LClosure *cl;
  TValue *k;
  StkId base;
 newframe:  /* reentry point when frame changes (call/return) */
  lua_assert(ci == L->ci);
  cl = clLvalue(ci->func);
  k = cl->p->k;
  base = ci->u.l.base;
  /* main loop of interpreter */
  for (;;) {
    Instruction i = *(ci->u.l.savedpc++);
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      Protect(traceexec(L));
    }
    /* WARNING: several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == ci->u.l.base);
    lua_assert(base <= L->top && L->top < L->stack + L->stacksize);
    vmdispatch (GET_OPCODE(i)) {
      vmcase(OP_MOVE,
        setobjs2s(L, ra, RB(i));
      )
      vmcase(OP_LOADK,
        TValue *rb = k + GETARG_Bx(i);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADKX,
        TValue *rb;
        lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
        rb = k + GETARG_Ax(*ci->u.l.savedpc++);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADBOOL,
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) ci->u.l.savedpc++;  /* skip next instruction (if C) */
      )
      vmcase(OP_LOADNIL,
        int b = GETARG_B(i);
        do {
          setnilvalue(ra++);
        } while (b--);
      )
      vmcase(OP_GETUPVAL,
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
      )
      vmcase(OP_GETTABUP,
        int b = GETARG_B(i);
        Protect(luaV_gettable(L, cl->upvals[b]->v, RKC(i), ra));
      )
      vmcase(OP_GETTABLE,
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
      )
      vmcase(OP_SETTABUP,
        int a = GETARG_A(i);
        Protect(luaV_settable(L, cl->upvals[a]->v, RKB(i), RKC(i)));
      )
      vmcase(OP_SETUPVAL,
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
      )
      vmcase(OP_SETTABLE,
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
      )
      vmcase(OP_NEWTABLE,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Table *t = luaH_new(L);
        sethvalue(L, ra, t);
        if (b != 0 || c != 0)
          luaH_resize(L, t, luaO_fb2int(b), luaO_fb2int(c));
        checkGC(L, ra + 1);
      )
      vmcase(OP_SELF,
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
      )
      vmcase(OP_ADD,
        arith_op(luai_numadd, TM_ADD);
      )
      vmcase(OP_SUB,
        arith_op(luai_numsub, TM_SUB);
      )
      vmcase(OP_MUL,
        arith_op(luai_nummul, TM_MUL);
      )
      vmcase(OP_DIV,
        arith_op(luai_numdiv, TM_DIV);
      )
      vmcase(OP_MOD,
        arith_op(luai_nummod, TM_MOD);
      )
      vmcase(OP_POW,
        arith_op(luai_numpow, TM_POW);
      )
      vmcase(OP_UNM,
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(L, nb));
        }
        else {
          Protect(luaV_arith(L, ra, rb, rb, TM_UNM));
        }
      )
      vmcase(OP_NOT,
        TValue *rb = RB(i);
        int res = l_isfalse(rb);  /* next assignment may change this value */
        setbvalue(ra, res);
      )
      vmcase(OP_LEN,
        Protect(luaV_objlen(L, ra, RB(i)));
      )
      vmcase(OP_CONCAT,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        StkId rb;
        L->top = base + c + 1;  /* mark the end of concat operands */
        Protect(luaV_concat(L, c - b + 1));
        ra = RA(i);  /* 'luav_concat' may invoke TMs and move the stack */
        rb = b + base;
        setobjs2s(L, ra, rb);
        checkGC(L, (ra >= rb ? ra + 1 : rb));
        L->top = ci->top;  /* restore top */
      )
      vmcase(OP_JMP,
        dojump(ci, i, 0);
      )
      vmcase(OP_EQ,
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (cast_int(equalobj(L, rb, rc)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LT,
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LE,
        Protect(
          if (luaV_lessequal(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_TEST,
        if (GETARG_C(i) ? l_isfalse(ra) : !l_isfalse(ra))
            ci->u.l.savedpc++;
          else
          donextjump(ci);
      )
      vmcase(OP_TESTSET,
        TValue *rb = RB(i);
        if (GETARG_C(i) ? l_isfalse(rb) : !l_isfalse(rb))
          ci->u.l.savedpc++;
        else {
          setobjs2s(L, ra, rb);
          donextjump(ci);
        }
      )
      vmcase(OP_CALL,
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        if (luaD_precall(L, ra, nresults)) {  /* C function? */
          if (nresults >= 0) L->top = ci->top;  /* adjust results */
          base = ci->u.l.base;
        }
        else {  /* Lua function */
          ci = L->ci;
          ci->callstatus |= CIST_REENTRY;
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_TAILCALL,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        if (luaD_precall(L, ra, LUA_MULTRET))  /* C function? */
          base = ci->u.l.base;
        else {
          /* tail call: put called frame (n) in place of caller one (o) */
          CallInfo *nci = L->ci;  /* called frame */
          CallInfo *oci = nci->previous;  /* caller frame */
          StkId nfunc = nci->func;  /* called function */
          StkId ofunc = oci->func;  /* caller function */
          /* last stack slot filled by 'precall' */
          StkId lim = nci->u.l.base + getproto(nfunc)->numparams;
          int aux;
          /* close all upvalues from previous call */
          if (cl->p->sizep > 0) luaF_close(L, oci->u.l.base);
          /* move new frame into old one */
          for (aux = 0; nfunc + aux < lim; aux++)
            setobjs2s(L, ofunc + aux, nfunc + aux);
          oci->u.l.base = ofunc + (nci->u.l.base - nfunc);  /* correct base */
          oci->top = L->top = ofunc + (L->top - nfunc);  /* correct top */
          oci->u.l.savedpc = nci->u.l.savedpc;
          oci->callstatus |= CIST_TAIL;  /* function was tail called */
          ci = L->ci = oci;  /* remove new frame */
          lua_assert(L->top == oci->u.l.base + getproto(ofunc)->maxstacksize);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcasenb(OP_RETURN,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (cl->p->sizep > 0) luaF_close(L, base);
        b = luaD_poscall(L, ra);
        if (!(ci->callstatus & CIST_REENTRY))  /* 'ci' still the called one */
          return;  /* external invocation: return */
        else {  /* invocation via reentry: continue execution */
          ci = L->ci;
          if (b) L->top = ci->top;
          lua_assert(isLua(ci));
          lua_assert(GET_OPCODE(*((ci)->u.l.savedpc - 1)) == OP_CALL);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_FORLOOP,
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(L, nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(L, 0, step) ? luai_numle(L, idx, limit)
                                   : luai_numle(L, limit, idx)) {
          ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
      )
      vmcase(OP_FORPREP,
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(L, nvalue(ra), nvalue(pstep)));
        ci->u.l.savedpc += GETARG_sBx(i);
      )
      vmcasenb(OP_TFORCALL,
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb + 3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i), 1));
        L->top = ci->top;
        i = *(ci->u.l.savedpc++);  /* go to next instruction */
        ra = RA(i);
        lua_assert(GET_OPCODE(i) == OP_TFORLOOP);
        goto l_tforloop;
      )
      vmcase(OP_TFORLOOP,
        l_tforloop:
        if (!ttisnil(ra + 1)) {  /* continue loop? */
          setobjs2s(L, ra, ra + 1);  /* save control variable */
           ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
        }
      )
      vmcase(OP_SETLIST,
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) n = cast_int(L->top - ra) - 1;
        if (c == 0) {
          lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
          c = GETARG_Ax(*ci->u.l.savedpc++);
        }
        luai_runtimecheck(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-allocate it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          luaH_setint(L, h, last--, val);
          luaC_barrierback(L, obj2gco(h), val);
        }
        L->top = ci->top;  /* correct top (in case of previous open call) */
      )
      vmcase(OP_CLOSURE,
        Proto *p = cl->p->p[GETARG_Bx(i)];
        Closure *ncl = getcached(p, cl->upvals, base);  /* cached closure */
        if (ncl == NULL)  /* no match? */
          pushclosure(L, p, cl->upvals, base, ra);  /* create a new one */
        else
          setclLvalue(L, ra, ncl);  /* push cashed closure */
        checkGC(L, ra + 1);
      )
      vmcase(OP_VARARG,
        int b = GETARG_B(i) - 1;
        int j;
        int n = cast_int(base - ci->func) - cl->p->numparams - 1;
        if (b < 0) {  /* B == 0? */
          b = n;  /* get all var. arguments */
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
      )
      vmcase(OP_EXTRAARG,
        lua_assert(0);
      )
    }
  }
}